

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

maybe<long> * __thiscall
rangeless::fn::impl::maybe<long>::operator=(maybe<long> *this,maybe<long> *other)

{
  long *val;
  maybe<long> *this_00;
  
  if (this != other) {
    this_00 = this;
    if (other->m_empty == false) {
      val = operator*(other);
      reset(this,val);
      this_00 = other;
    }
    reset(this_00);
  }
  return this;
}

Assistant:

maybe& operator=(maybe&& other) noexcept
        {
            if(this == &other) {
                ;
            } else if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            } else {
                reset();
            }
            return *this;
        }